

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

size_t __thiscall
trieste::PassDef::apply_special<true,false,true>(PassDef *this,Node *root,Match *match)

{
  Effect<Node> *pEVar1;
  TokenDef *pTVar2;
  long *plVar3;
  Effect<Node> *pEVar4;
  element_type *peVar5;
  element_type *peVar6;
  PassDef *pPVar7;
  char cVar8;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var9;
  long lVar10;
  uint uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  ptrdiff_t pVar14;
  Effect<Node> *pEVar15;
  size_t sVar16;
  bool bVar17;
  iterator start;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  Node root_1;
  iterator start_1;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_a8;
  size_t local_98;
  uint local_8c;
  NodeIt local_88;
  iterator iStack_80;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_78;
  PassDef *local_70;
  element_type *local_68;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Token local_50;
  NodeIt local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Base_ptr local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa0,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pTVar2 = (local_60->type_).def;
  uVar11 = pTVar2->fl;
  local_70 = this;
  if (((uVar11 & 0x40) == 0) &&
     (local_50.def = *(TokenDef **)
                      ((long)(this->rule_map).map._M_elems +
                      (ulong)(pTVar2->default_map_id & 0xfffffff8)),
     *(char *)((long)(local_50.def + 0x41) + 8) == '\0')) {
    local_88._M_current =
         (local_60->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_8c = uVar11;
    if ((element_type *)local_88._M_current ==
        (element_type *)
        (local_60->children).
        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_98 = 0;
    }
    else {
      local_98 = 0;
      do {
        local_a8.first = local_88._M_current;
        plVar3 = *(long **)((long)(local_50.def + 1) + 8U +
                           (ulong)((((((local_88._M_current)->
                                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->type_).def)->default_map_id & 0xfffffff8));
        pEVar15 = (Effect<Node> *)*plVar3;
        pEVar4 = (Effect<Node> *)plVar3[1];
        if (pEVar15 == pEVar4) {
          pVar14 = -1;
        }
        else {
          pEVar15 = pEVar15 + 4;
          pVar14 = -1;
          do {
            match->index = 0;
            ((match->captures).
             super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = false;
            plVar3 = *(long **)&pEVar15[-4].super__Function_base._M_functor;
            cVar8 = (**(code **)(*plVar3 + 0x20))
                              (plVar3,&local_88,(Node *)&stack0xffffffffffffffa0,match);
            if (cVar8 == '\0') {
LAB_00176083:
              local_88._M_current = local_a8.first;
              bVar17 = false;
            }
            else {
              local_68 = (element_type *)local_88._M_current;
              _Var9 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                (local_a8.first);
              if ((element_type *)_Var9._M_current != local_68) goto LAB_00176083;
              pVar14 = replace(local_70,match,pEVar15,(NodeIt *)&local_a8,&local_88,
                               (Node *)&stack0xffffffffffffffa0);
              if (pVar14 == -1) {
                pVar14 = -1;
                goto LAB_00176083;
              }
              local_98 = local_98 + pVar14;
              bVar17 = true;
            }
          } while ((!bVar17) && (pEVar1 = pEVar15 + 1, pEVar15 = pEVar15 + 5, pEVar1 != pEVar4));
        }
        if (pVar14 == -1) {
          local_88._M_current = local_88._M_current + 1;
        }
        else if ((local_70->direction_ & 4) == 0) {
          local_88._M_current =
               (local_60->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          local_88._M_current = local_88._M_current + pVar14;
        }
        uVar11 = local_8c;
      } while ((element_type *)local_88._M_current !=
               (element_type *)
               (local_60->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    local_98 = 0;
  }
  pPVar7 = local_70;
  if ((uVar11 & 0x40) == 0) {
    local_88._M_current = (shared_ptr<trieste::NodeDef> *)0x0;
    iStack_80._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_78 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_a8.second._M_current =
         (local_60->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8.first = (shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffa0;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_88,(iterator)0x0,&local_a8);
    if ((pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
         *)local_88._M_current != iStack_80._M_current) {
      local_38 = &(pPVar7->post_)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        peVar5 = *(element_type **)((long)iStack_80._M_current + 0xffffffffffffff90U + 0x60);
        peVar6 = *(element_type **)((long)iStack_80._M_current + 0xffffffffffffff90U + 0x68);
        if (peVar6 == (element_type *)
                      *(pointer *)
                       ((long)&((peVar5->super_enable_shared_from_this<trieste::NodeDef>).
                                _M_weak_this.
                                super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->children + 8)) {
          peVar6 = (peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                   super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var12 = (local_70->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = local_38;
          if (p_Var12 != (_Base_ptr)0x0) {
            do {
              bVar17 = *(TokenDef **)(p_Var12 + 1) < (peVar6->type_).def;
              if (!bVar17) {
                p_Var13 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[bVar17];
            } while (p_Var12 != (_Base_ptr)0x0);
          }
          p_Var12 = local_38;
          if ((p_Var13 != local_38) &&
             (p_Var12 = p_Var13, (peVar6->type_).def < *(TokenDef **)(p_Var13 + 1))) {
            p_Var12 = local_38;
          }
          sVar16 = local_98;
          if (p_Var12 != local_38) {
            local_a8.second._M_current =
                 (shared_ptr<trieste::NodeDef> *)
                 (peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                 super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a8.second._M_current)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a8.second._M_current)->_M_use_count + 1;
              }
            }
            local_a8.first = (shared_ptr<trieste::NodeDef> *)peVar6;
            if (p_Var12[1]._M_right == (_Base_ptr)0x0) {
              std::__throw_bad_function_call();
            }
            lVar10 = (**(code **)(p_Var12 + 2))(&p_Var12[1]._M_parent,&local_a8);
            sVar16 = lVar10 + local_98;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)
              ;
            }
          }
          iStack_80._M_current =
               (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)((long)iStack_80._M_current + 0xffffffffffffff90U + 0x60);
          local_98 = sVar16;
        }
        else {
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           ((long)iStack_80._M_current + 0xffffffffffffff90U + 0x68) =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&peVar6->type_;
          lVar10 = *(long *)(*(long *)&(peVar6->super_enable_shared_from_this<trieste::NodeDef>).
                                       _M_weak_this + 0x10);
          local_8c = *(uint *)(lVar10 + 8);
          if ((local_8c & 0x40) == 0) {
            local_50.def = *(TokenDef **)
                            ((long)(local_70->rule_map).map._M_elems +
                            (ulong)(*(uint *)(lVar10 + 0xc) & 0xfffffff8));
            if ((*(char *)((long)(local_50.def + 0x41) + 8) == '\0') &&
               (local_a8.first =
                     *(shared_ptr<trieste::NodeDef> **)
                      (*(long *)&(peVar6->super_enable_shared_from_this<trieste::NodeDef>).
                                 _M_weak_this + 0x58),
               (element_type *)local_a8.first !=
               *(element_type **)
                (*(long *)&(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this +
                0x60))) {
              local_68 = (element_type *)0x0;
              do {
                local_48._M_current = local_a8.first;
                plVar3 = *(long **)((long)(local_50.def + 1) + 8U +
                                   (ulong)(*(uint *)(*(long *)(*(long *)&(((
                                                  enable_shared_from_this<trieste::NodeDef> *)
                                                  &(local_a8.first)->
                                                                                                      
                                                  super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                                  )->_M_weak_this).
                                                  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                                  + 0x10) + 0xc) & 0xfffffff8));
                pEVar15 = (Effect<Node> *)*plVar3;
                pEVar4 = (Effect<Node> *)plVar3[1];
                if (pEVar15 == pEVar4) {
                  pVar14 = -1;
                }
                else {
                  pEVar15 = pEVar15 + 4;
                  pVar14 = -1;
                  do {
                    match->index = 0;
                    ((match->captures).
                     super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first = false;
                    plVar3 = *(long **)&pEVar15[-4].super__Function_base._M_functor;
                    cVar8 = (**(code **)(*plVar3 + 0x20))(plVar3,&local_a8,peVar6,match);
                    if (cVar8 == '\0') {
LAB_001762b4:
                      local_a8.first = local_48._M_current;
                      bVar17 = false;
                    }
                    else {
                      local_40._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.first;
                      _Var9 = std::
                              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                        (local_48._M_current);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_current !=
                          local_40._M_pi) goto LAB_001762b4;
                      pVar14 = replace(local_70,match,pEVar15,&stack0xffffffffffffffb8,
                                       (NodeIt *)&local_a8,(Node *)peVar6);
                      if (pVar14 == -1) {
                        pVar14 = -1;
                        goto LAB_001762b4;
                      }
                      local_68 = (element_type *)
                                 ((long)&((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                           *)&local_68->
                                              super_enable_shared_from_this<trieste::NodeDef>)->
                                         _M_ptr + pVar14);
                      bVar17 = true;
                    }
                  } while ((!bVar17) &&
                          (pEVar1 = pEVar15 + 1, pEVar15 = pEVar15 + 5, pEVar1 != pEVar4));
                }
                if (pVar14 == -1) {
                  local_a8.first = (shared_ptr<trieste::NodeDef> *)((long)local_a8.first + 0x10);
                }
                else if ((local_70->direction_ & 4) == 0) {
                  local_a8.first =
                       *(shared_ptr<trieste::NodeDef> **)
                        (*(long *)&(peVar6->super_enable_shared_from_this<trieste::NodeDef>).
                                   _M_weak_this + 0x58);
                }
                else {
                  local_a8.first =
                       (shared_ptr<trieste::NodeDef> *)
                       ((long)&(local_a8.first)->
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> +
                       pVar14 * 0x10);
                }
              } while ((element_type *)local_a8.first !=
                       *(element_type **)
                        (*(long *)&(peVar6->super_enable_shared_from_this<trieste::NodeDef>).
                                   _M_weak_this + 0x60));
            }
            else {
              local_68 = (element_type *)0x0;
            }
            local_98 = (long)&((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                              &local_68->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr +
                       local_98;
          }
          if ((local_8c & 0x40) == 0) {
            local_a8.second._M_current =
                 *(shared_ptr<trieste::NodeDef> **)
                  (*(long *)&(peVar6->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this
                  + 0x58);
            local_a8.first = (shared_ptr<trieste::NodeDef> *)peVar6;
            if (iStack_80._M_current == local_78) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_88,iStack_80,&local_a8);
            }
            else {
              (iStack_80._M_current)->first = (shared_ptr<trieste::NodeDef> *)peVar6;
              ((iStack_80._M_current)->second)._M_current = local_a8.second._M_current;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
      } while ((pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)local_88._M_current != iStack_80._M_current);
    }
    if ((element_type *)local_88._M_current != (element_type *)0x0) {
      operator_delete(local_88._M_current,(long)local_78 - (long)local_88._M_current);
    }
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return local_98;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }